

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box_Hierarchy.h
# Opt level: O3

void __thiscall Nova::Box_Hierarchy<float,_2>::~Box_Hierarchy(Box_Hierarchy<float,_2> *this)

{
  ~Box_Hierarchy(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Box_Hierarchy()
    {Clear();}